

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O0

char * Io_ReadDsdFindEnd(char *pCur)

{
  int local_24;
  char *pcStack_20;
  int nParts;
  char *pEnd;
  char *pCur_local;
  
  local_24 = 0;
  pcStack_20 = pCur;
  if (*pCur != '(') {
    __assert_fail("*pCur == \'(\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                  ,0x31,"char *Io_ReadDsdFindEnd(char *)");
  }
  while( true ) {
    if (*pcStack_20 == '\0') {
      return (char *)0x0;
    }
    if (*pcStack_20 == '(') {
      local_24 = local_24 + 1;
    }
    else if (*pcStack_20 == ')') {
      local_24 = local_24 + -1;
    }
    if (local_24 == 0) break;
    pcStack_20 = pcStack_20 + 1;
  }
  return pcStack_20;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds the end of the part.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Io_ReadDsdFindEnd( char * pCur )
{
    char * pEnd;
    int nParts = 0;
    assert( *pCur == '(' );
    for ( pEnd = pCur; *pEnd; pEnd++ )
    {
        if ( *pEnd == '(' )
            nParts++;
        else if ( *pEnd == ')' )
            nParts--;
        if ( nParts == 0 )
            return pEnd;
    }
    return NULL;
}